

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg-idct.c
# Opt level: O0

void pjpeg_idct_2D_u32(int32_t *in,uint8_t *out,uint32_t outstride)

{
  int local_250;
  int32_t v;
  int32_t offset;
  int i;
  int x_1;
  int y_1;
  int x;
  int32_t tmp2 [64];
  int local_12c;
  int32_t local_128;
  int y;
  int32_t tmp [64];
  uint32_t outstride_local;
  uint8_t *out_local;
  int32_t *in_local;
  
  for (local_12c = 0; local_12c < 8; local_12c = local_12c + 1) {
    idct_1D_u32(in + (local_12c << 3),1,&local_128 + (local_12c << 3),1);
  }
  for (x_1 = 0; x_1 < 8; x_1 = x_1 + 1) {
    idct_1D_u32(&local_128 + x_1,8,&y_1 + x_1,8);
  }
  for (i = 0; i < 8; i = i + 1) {
    for (offset = 0; offset < 8; offset = offset + 1) {
      local_250 = (&y_1)[i * 8 + offset] + 0x2020000 >> 0x12;
      if (local_250 < 0) {
        local_250 = 0;
      }
      if (0xff < local_250) {
        local_250 = 0xff;
      }
      out[i * outstride + offset] = (uint8_t)local_250;
    }
  }
  return;
}

Assistant:

void pjpeg_idct_2D_u32(int32_t in[64], uint8_t *out, uint32_t outstride)
{
    int32_t tmp[64];

    // idct on rows
    for (int y = 0; y < 8; y++)
        idct_1D_u32(&in[8*y], 1, &tmp[8*y], 1);

    int32_t tmp2[64];

    // idct on columns
    for (int x = 0; x < 8; x++)
        idct_1D_u32(&tmp[x], 8, &tmp2[x], 8);

    // scale, adjust bias, and clamp
    for (int y = 0; y < 8; y++) {
        for (int x = 0; x < 8; x++) {
            int i = 8*y + x;

            // Shift of 18: the divide by 4 as part of the idct, and a shift by 16
            // to undo the fixed-point arithmetic. (We accumulated 8 bits of
            // fractional precision during each of the row and column IDCTs)
            //
            // Originally:
            //            int32_t v = (tmp2[i] >> 18) + 128;
            //
            // Move the add before the shift and we can do rounding at
            // the same time.
            const int32_t offset = (128 << 18) + (1 << 17);
            int32_t v = (tmp2[i] + offset) >> 18;

            if (v < 0)
                v = 0;
            if (v > 255)
                v = 255;

            out[y*outstride + x] = v;
        }
    }
}